

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerCountZeros(I64ToI32Lowering *this,Unary *curr)

{
  Index index;
  pointer pBVar1;
  LocalSet *any;
  Block *result_00;
  Block *result;
  LocalSet *setLow;
  Type local_68;
  undefined1 local_60 [8];
  TempVar lowBits;
  TempVar highBits;
  anon_class_8_1_8991fb9c lower;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)this;
  fetchOutParam((TempVar *)&lowBits.ty,this,curr->value);
  wasm::Type::Type(&local_68,i32);
  getTemp((TempVar *)local_60,this,local_68);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
  any = Builder::makeLocalSet(pBVar1,index,curr->value);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  result_00 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)0x0);
  if (curr->op == ClzInt64) {
    lowerCountZeros::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&highBits.ty,result_00,ClzInt32,(TempVar *)&lowBits.ty,
               (TempVar *)local_60);
    TempVar::~TempVar((TempVar *)local_60);
    TempVar::~TempVar((TempVar *)&lowBits.ty);
    return;
  }
  if (curr->op != CtzInt64) {
    abort();
  }
  handle_unreachable("i64.ctz should be removed already",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                     ,899);
}

Assistant:

void lowerCountZeros(Unary* curr) {
    auto lower = [&](Block* result,
                     UnaryOp op32,
                     TempVar&& first,
                     TempVar&& second) {
      TempVar highResult = getTemp();
      TempVar firstResult = getTemp();
      LocalSet* setFirst = builder->makeLocalSet(
        firstResult,
        builder->makeUnary(op32, builder->makeLocalGet(first, Type::i32)));

      Binary* check =
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(firstResult, Type::i32),
                            builder->makeConst(int32_t(32)));

      If* conditional = builder->makeIf(
        check,
        builder->makeBinary(
          AddInt32,
          builder->makeUnary(op32, builder->makeLocalGet(second, Type::i32)),
          builder->makeConst(int32_t(32))),
        builder->makeLocalGet(firstResult, Type::i32));

      LocalSet* setHigh =
        builder->makeLocalSet(highResult, builder->makeConst(int32_t(0)));

      setOutParam(result, std::move(highResult));

      replaceCurrent(builder->blockify(result, setFirst, setHigh, conditional));
    };

    TempVar highBits = fetchOutParam(curr->value);
    TempVar lowBits = getTemp();
    LocalSet* setLow = builder->makeLocalSet(lowBits, curr->value);
    Block* result = builder->blockify(setLow);

    switch (curr->op) {
      case ClzInt64:
        lower(result, ClzInt32, std::move(highBits), std::move(lowBits));
        break;
      case CtzInt64:
        WASM_UNREACHABLE("i64.ctz should be removed already");
        break;
      default:
        abort();
    }
  }